

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.c
# Opt level: O0

stumpless_target * stumpless_open_socket_target(char *name,char *param_2)

{
  stumpless_target *target_00;
  size_t dest_len;
  size_t source_len;
  socket_target *psVar1;
  size_t source_len_00;
  size_t temp_name_len;
  char temp_name [18];
  size_t local_socket_len;
  size_t name_len;
  stumpless_target *target;
  char *local_socket_local;
  char *name_local;
  
  if (name == (char *)0x0) {
    raise_argument_empty("name was NULL");
  }
  else {
    target_00 = new_target(STUMPLESS_SOCKET_TARGET,name);
    if (target_00 != (stumpless_target *)0x0) {
      dest_len = strlen(name);
      if (param_2 == (char *)0x0) {
        source_len = abstract_socket_names_get_local_socket_name((char *)&temp_name_len);
        psVar1 = new_socket_target(name,dest_len,(char *)&temp_name_len,source_len);
        target_00->id = psVar1;
      }
      else {
        source_len_00 = strlen(param_2);
        psVar1 = new_socket_target(name,dest_len,param_2,source_len_00);
        target_00->id = psVar1;
      }
      if (target_00->id != (stumpless_id_t)0x0) {
        stumpless_set_current_target(target_00);
        return target_00;
      }
      destroy_target(target_00);
    }
  }
  return (stumpless_target *)0x0;
}

Assistant:

struct stumpless_target *
stumpless_open_socket_target( const char *name,
                              const char *local_socket ) {
  struct stumpless_target *target;
  size_t name_len;
  size_t local_socket_len;
  char temp_name[18];
  size_t temp_name_len;

  VALIDATE_ARG_NOT_NULL( name );

  target = new_target( STUMPLESS_SOCKET_TARGET, name );

  if( !target ) {
    goto fail;
  }

  name_len = strlen( name );

  if( !local_socket ) {
    temp_name_len = config_get_local_socket_name( temp_name );
    target->id = new_socket_target( name, name_len, temp_name, temp_name_len );
  } else {
    local_socket_len = strlen( local_socket );
    target->id =
      new_socket_target( name, name_len, local_socket, local_socket_len );
  }

  if( !target->id ) {
    goto fail_id;
  }

  stumpless_set_current_target( target );
  return target;

fail_id:
  destroy_target( target );
fail:
  return NULL;
}